

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

part_mask_t duckdb::DatePart::StructOperator::GetMask(part_codes_t *part_codes)

{
  ulong uVar1;
  InternalException *this;
  pointer pDVar2;
  string local_40;
  
  uVar1 = 0;
  for (pDVar2 = (part_codes->
                super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>)
                .
                super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 != (part_codes->
                super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>)
                .
                super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_finish; pDVar2 = pDVar2 + 1) {
    switch(*pDVar2) {
    case BEGIN_BIGINT:
    case MONTH:
    case DAY:
    case DECADE:
    case CENTURY:
    case MILLENNIUM:
    case QUARTER:
    case ERA:
      uVar1 = uVar1 | 1;
      break;
    case MICROSECONDS:
    case MILLISECONDS:
    case SECOND:
    case MINUTE:
    case HOUR:
      uVar1 = uVar1 | 0x10;
      break;
    case DOW:
    case ISODOW:
      uVar1 = uVar1 | 2;
      break;
    case WEEK:
    case ISOYEAR:
    case YEARWEEK:
      uVar1 = uVar1 | 0x40;
      break;
    case DOY:
      uVar1 = uVar1 | 4;
      break;
    case TIMEZONE:
    case TIMEZONE_HOUR:
    case TIMEZONE_MINUTE:
      uVar1 = uVar1 | 0x20;
      break;
    case BEGIN_DOUBLE:
      uVar1 = uVar1 | 8;
      break;
    case JULIAN_DAY:
      uVar1 = uVar1 | 0x80;
      break;
    case BEGIN_INVALID:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Invalid DatePartSpecifier for STRUCT mask!","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return uVar1;
}

Assistant:

int64_t DatePart::EpochNanosecondsOperator::Operation(timestamp_t input) {
	D_ASSERT(Timestamp::IsFinite(input));
	return Timestamp::GetEpochNanoSeconds(input);
}